

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

uchar * x509v3_hex_to_bytes(char *str,size_t *len)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  size_t sVar4;
  byte *orig_ptr;
  int line;
  byte *pbVar5;
  byte *pbVar6;
  uint8_t low;
  undefined8 uStack_38;
  uint8_t high;
  
  if (str == (char *)0x0) {
    iVar3 = 0x7c;
    line = 0x1c0;
  }
  else {
    uStack_38 = in_RAX;
    sVar4 = strlen(str);
    orig_ptr = (byte *)OPENSSL_malloc(sVar4 >> 1);
    if (orig_ptr == (byte *)0x0) {
      OPENSSL_free((void *)0x0);
      return (uchar *)0x0;
    }
    pbVar5 = orig_ptr;
    while( true ) {
      str = (char *)((byte *)str + 1);
      do {
        pbVar6 = (byte *)str;
        bVar1 = pbVar6[-1];
        if (bVar1 == 0) {
          if (len == (size_t *)0x0) {
            return orig_ptr;
          }
          *len = (long)pbVar5 - (long)orig_ptr;
          return orig_ptr;
        }
        str = (char *)(pbVar6 + 1);
      } while (bVar1 == 0x3a);
      bVar2 = *pbVar6;
      if (bVar2 == 0) {
        ERR_put_error(0x14,0,0x92,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                      ,0x1ce);
        OPENSSL_free(orig_ptr);
        return (uchar *)0x0;
      }
      iVar3 = OPENSSL_fromxdigit(&high,(uint)bVar1);
      if ((iVar3 == 0) || (iVar3 = OPENSSL_fromxdigit(&low,(uint)bVar2), iVar3 == 0)) break;
      *pbVar5 = high << 4 | low;
      pbVar5 = pbVar5 + 1;
    }
    OPENSSL_free(orig_ptr);
    iVar3 = 0x76;
    line = 0x1e7;
  }
  ERR_put_error(0x14,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                ,line);
  return (uchar *)0x0;
}

Assistant:

unsigned char *x509v3_hex_to_bytes(const char *str, size_t *len) {
  unsigned char *hexbuf, *q;
  unsigned char ch, cl, *p;
  uint8_t high, low;
  if (!str) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NULL_ARGUMENT);
    return NULL;
  }
  if (!(hexbuf =
            reinterpret_cast<uint8_t *>(OPENSSL_malloc(strlen(str) >> 1)))) {
    goto err;
  }
  for (p = (unsigned char *)str, q = hexbuf; *p;) {
    ch = *p++;
    if (ch == ':') {
      continue;
    }
    cl = *p++;
    if (!cl) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_ODD_NUMBER_OF_DIGITS);
      OPENSSL_free(hexbuf);
      return NULL;
    }
    if (!OPENSSL_fromxdigit(&high, ch)) {
      goto badhex;
    }
    if (!OPENSSL_fromxdigit(&low, cl)) {
      goto badhex;
    }
    *q++ = (high << 4) | low;
  }

  if (len) {
    *len = q - hexbuf;
  }

  return hexbuf;

err:
  OPENSSL_free(hexbuf);
  return NULL;

badhex:
  OPENSSL_free(hexbuf);
  OPENSSL_PUT_ERROR(X509V3, X509V3_R_ILLEGAL_HEX_DIGIT);
  return NULL;
}